

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::ExtractVariants(Stage *stage,Dictionary *dict,string *err)

{
  bool bVar1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  allocator local_69;
  string local_68;
  reference local_48;
  Prim *prim;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  string *err_local;
  Dictionary *dict_local;
  Stage *stage_local;
  
  if (dict == (Dictionary *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`dict` argument is nullptr.\n");
    }
    stage_local._7_1_ = false;
  }
  else {
    this = Stage::root_prims(stage);
    __end1._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                           ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
    prim = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&prim), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                 ::operator*(&__end1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_68,"",&local_69);
      bVar1 = anon_unknown_160::ExtractVariantsRec(0,&local_68,local_48,dict,0x100000,err);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end1);
    }
    stage_local._7_1_ = true;
  }
  return stage_local._7_1_;
}

Assistant:

bool ExtractVariants(const Stage &stage, Dictionary *dict, std::string *err) {
  if (!dict) {
    if (err) {
      (*err) += "`dict` argument is nullptr.\n";
    }

    return false;
  }

  for (const auto &prim : stage.root_prims()) {
    if (!ExtractVariantsRec(/* depth */ 0, /* root path */ "", prim, (*dict),
                            /* max_depth */ 1024 * 1024, err)) {
      return false;
    }
  }

  return true;
}